

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O0

void __thiscall OpenMD::RadialDistrFunc::process(RadialDistrFunc *this)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  long *in_RDI;
  int nIntersect;
  int i;
  int nFrames;
  DumpReader reader;
  SelectionManager *in_stack_ffffffffffffea78;
  int in_stack_ffffffffffffea80;
  int in_stack_ffffffffffffea84;
  SelectionSet *in_stack_ffffffffffffea88;
  undefined4 in_stack_ffffffffffffea90;
  int in_stack_ffffffffffffea94;
  SelectionManager *in_stack_ffffffffffffeaa0;
  SelectionManager *in_stack_ffffffffffffeaa8;
  SelectionEvaluator *in_stack_ffffffffffffeab8;
  int in_stack_ffffffffffffeb0c;
  DumpReader *in_stack_ffffffffffffeb10;
  string *in_stack_ffffffffffffecd0;
  SimInfo *in_stack_ffffffffffffecd8;
  DumpReader *in_stack_ffffffffffffece0;
  int local_1278;
  
  (**(code **)(*in_RDI + 0x20))();
  DumpReader::DumpReader
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd0);
  iVar2 = DumpReader::getNFrames
                    ((DumpReader *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
  *(int *)(in_RDI + 0x22) = iVar2 / (int)in_RDI[6];
  for (local_1278 = 0; local_1278 < iVar2; local_1278 = (int)in_RDI[6] + local_1278) {
    DumpReader::readFrame(in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb0c);
    this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI[0x19] = (long)pSVar3;
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x23));
    if (bVar1) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeab8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                 in_stack_ffffffffffffea88);
      SelectionSet::~SelectionSet((SelectionSet *)0x1a1257);
      (**(code **)(*in_RDI + 0x58))(in_RDI,in_RDI + 0x177);
    }
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xcd));
    if (bVar1) {
      in_stack_ffffffffffffeab8 = (SelectionEvaluator *)(in_RDI + 400);
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeab8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea94,in_stack_ffffffffffffea90),
                 in_stack_ffffffffffffea88);
      SelectionSet::~SelectionSet((SelectionSet *)0x1a1320);
      (**(code **)(*in_RDI + 0x60))(in_RDI,in_RDI + 400);
    }
    (**(code **)(*in_RDI + 0x40))();
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x23));
    if ((bVar1) ||
       (bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xcd)), bVar1)) {
      operator&(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
      in_stack_ffffffffffffeaa8 = (SelectionManager *)(in_RDI + 0x1db);
      in_stack_ffffffffffffeaa0 = (SelectionManager *)&stack0xffffffffffffec90;
      SelectionManager::operator=
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80),
                 in_stack_ffffffffffffea78);
      SelectionManager::~SelectionManager
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
      OpenMD::operator-(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
      SelectionManager::operator=
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80),
                 in_stack_ffffffffffffea78);
      SelectionManager::~SelectionManager
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
      OpenMD::operator-(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
      in_stack_ffffffffffffea88 = (SelectionSet *)&stack0xffffffffffffeb00;
      SelectionManager::operator=
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80),
                 in_stack_ffffffffffffea78);
      SelectionManager::~SelectionManager
                ((SelectionManager *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
      in_stack_ffffffffffffea94 = SelectionManager::getSelectionCount((SelectionManager *)0x1a14af);
      *(int *)((long)in_RDI + 0xfa4) = in_stack_ffffffffffffea94;
      in_stack_ffffffffffffea84 = SelectionManager::getSelectionCount((SelectionManager *)0x1a14d0);
      *(int *)(in_RDI + 0x1f5) = in_stack_ffffffffffffea84;
      in_stack_ffffffffffffea80 = SelectionManager::getSelectionCount((SelectionManager *)0x1a14f1);
      *(int *)(in_RDI + 500) =
           *(int *)((long)in_RDI + 0xfa4) * (int)in_RDI[0x1f5] -
           ((in_stack_ffffffffffffea80 + 1) * in_stack_ffffffffffffea80) / 2;
    }
    (**(code **)(*in_RDI + 0x30))(in_RDI,in_RDI + 0x1a9,in_RDI + 400);
    (**(code **)(*in_RDI + 0x30))(in_RDI,in_RDI + 0x1db,in_RDI + 0x1c2);
    (**(code **)(*in_RDI + 0x38))(in_RDI,in_RDI + 0x1db);
    (**(code **)(*in_RDI + 0x50))();
  }
  (**(code **)(*in_RDI + 0x28))();
  (**(code **)(*in_RDI + 0x68))();
  DumpReader::~DumpReader
            ((DumpReader *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
  return;
}

Assistant:

void RadialDistrFunc::process() {
    preProcess();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
        validateSelection1(seleMan1_);
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
        validateSelection2(seleMan2_);
      }

      initializeHistogram();

      // Selections may overlap, and we need a bit of logic to deal
      // with this.
      //
      // |     s1    |
      // | s1 -c | c |
      //         | c | s2 - c |
      //         |    s2      |
      //
      // s1 : Set of StuntDoubles in selection1
      // s2 : Set of StuntDoubles in selection2
      // c  : Intersection of selection1 and selection2
      //
      // When we loop over the pairs, we can divide the looping into 3
      // stages:
      //
      // Stage 1 :     [s1-c]      [s2]
      // Stage 2 :     [c]         [s2 - c]
      // Stage 3 :     [c]         [c]
      // Stages 1 and 2 are completely non-overlapping.
      // Stage 3 is completely overlapping.

      if (evaluator1_.isDynamic() || evaluator2_.isDynamic()) {
        common_             = seleMan1_ & seleMan2_;
        sele1_minus_common_ = seleMan1_ - common_;
        sele2_minus_common_ = seleMan2_ - common_;
        nSelected1_         = seleMan1_.getSelectionCount();
        nSelected2_         = seleMan2_.getSelectionCount();
        int nIntersect      = common_.getSelectionCount();

        nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
      }

      processNonOverlapping(sele1_minus_common_, seleMan2_);
      processNonOverlapping(common_, sele2_minus_common_);
      processOverlapping(common_);

      processHistogram();
    }

    postProcess();

    writeRdf();
  }